

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O3

int asl::yearFromTime(double t)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  
  dVar8 = floor(t * 1.1574074074074073e-05);
  iVar1 = (int)dVar8;
  if (iVar1 + 0x5e2aU < 0x11637) {
    uVar5 = (iVar1 + 0x5e2bU) / 0x5b5;
    uVar3 = ((iVar1 + 0x5e2bU) / 0x5b5) * 4 + 0x770;
    uVar2 = iVar1 + uVar5 * -0x5b5 + 0x5e2b;
    if ((int)uVar2 < 0x2db) {
      if ((int)uVar2 < 0x16e) {
        return uVar3;
      }
      return uVar5 * 4 + 0x771;
    }
  }
  else {
    iVar6 = (iVar1 + 0xafaa8) / 0x23ab1;
    iVar4 = iVar6 * 400;
    iVar1 = iVar6 * -0x23ab1 + iVar1;
    iVar6 = iVar1 + 0xafaa8;
    if (iVar6 < 0x8eae) {
      iVar1 = iVar6 / 0x5b5;
      iVar7 = iVar1 * -0x5b5;
    }
    else {
      uVar3 = (iVar1 + 0xa6bfbU) / 0x8eac;
      iVar4 = iVar4 + uVar3 * 100 + 100;
      iVar1 = iVar6 + uVar3 * -0x8eac;
      iVar6 = iVar1 + -0x8ead;
      if (iVar6 < 0x5b5) {
        return iVar6 / 0x16d + iVar4;
      }
      uVar3 = (iVar1 - 0x9461U) / 0x5b5;
      iVar1 = uVar3 + 1;
      iVar7 = uVar3 * -0x5b5 + -0x5b4;
    }
    uVar2 = iVar6 + iVar7;
    uVar3 = iVar4 + iVar1 * 4;
    if ((int)uVar2 < 0x2db) {
      return uVar3 | 0x16d < (int)uVar2;
    }
  }
  return 3 - (uVar2 < 0x448) | uVar3;
}

Assistant:

static int yearFromTime(double t)
{
	static const int d4y = 365 * 4 + 1;     // 4 year block with 1 leap
	static const int d100y = d4y * 25 - 1;  // 100 year block (except multiples of 400)
	static const int d400y = 4 * d100y + 1; // 400 year block (one more leap for the first year in the block)

	int d = (int)floor(t * (1 / 86400.0)) + d400y * 4 + d100y + 1 + d100y * 2 + d4y - 1 + 16 * d4y + 2 * 365 + 1;
	//(1970 = 4 * 400 + 3 * 100 + 17 * 4 + 2)
	if (d > 695421 && d < 766645) // 1904 - 2099 : all d4y blocks
	{
		d -= 695421;
		int year = 1904;
		int k3 = (d / d4y); // num blocks 4y
		int j3 = k3 * d4y;  // start of current 4y block
		year += k3 * 4;
		d -= j3;
		if (d >= 366 + 365)
			year += (d < 366 + 2 * 365) ? 2 : 3;
		else if (d >= 366)
			year += 1;
		return year;
	}

	int k1 = (d / d400y); // num blocks 400y
	int j1 = k1 * d400y;  // start of current 400y block
	int year = k1 * 400;
	d = d - j1; // time relative to current 400y block
	int k2 = 0, j2 = 0;
	if (d > d100y + 1)
	{
		k2 = 1 + ((d - d100y - 1) / d100y); // num blocks 100y
		j2 = d100y + 1 + (k2 - 1) * d100y;
	}
	year += k2 * 100;
	d = d - j2;
	int k3 = 0, j3 = 0;
	if (k2 == 0) // first 100y block -> all d4y
	{
		k3 = (d / d4y); // num blocks 4y
		j3 = k3 * d4y;  // start of current 4y block
	}
	else if (d > d4y - 1)
	{
		k3 = 1 + ((d - d4y + 1) / d4y);
		j3 = d4y - 1 + (k3 - 1) * d4y;
	}
	d = d - j3; // time relative to current 4y block
	year += k3 * 4;
	if (k3 == 0 && k2 != 0) // all 365d
		year += (d / 365);
	else if (d >= 366 + 365)
		year += (d < 366 + 2 * 365) ? 2 : 3;
	else if (d >= 366)
		year += 1;
	return year;
}